

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cortex.cpp
# Opt level: O0

void LogMessage(int iLevel,char *szMsg,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *in_RSI;
  int in_EDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list arg_list;
  char *str_tmp;
  undefined1 auStack_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined4 local_38;
  undefined4 local_34;
  undefined1 *local_30;
  undefined1 *local_28;
  char *local_18;
  char *local_10;
  int local_4;
  
  local_28 = auStack_e8;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  if (in_EDI <= User_VerbosityLevel) {
    local_18 = (char *)0x0;
    local_30 = &stack0x00000008;
    local_34 = 0x30;
    local_38 = 0x10;
    local_d8 = in_RDX;
    local_d0 = in_RCX;
    local_c8 = in_R8;
    local_c0 = in_R9;
    local_10 = in_RSI;
    local_4 = in_EDI;
    vasprintf(&local_18,in_RSI,&local_38);
    (*CB_ErrorMsgHandler)(local_4,local_18);
    free(local_18);
  }
  return;
}

Assistant:

void LogMessage(int iLevel, const char *szMsg, ...)
{
  if (iLevel <= User_VerbosityLevel) {
    // create char* from input
    char* str_tmp = NULL;
    va_list arg_list;
    va_start(arg_list, szMsg);
    (void) vasprintf(&str_tmp, szMsg, arg_list);
    CB_ErrorMsgHandler(iLevel, str_tmp);
    free(str_tmp);
  }
}